

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_red.c
# Opt level: O3

void ppRedTrinomial(word *a,pp_trinom_st *p)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar6 = p->m;
  bVar2 = (byte)uVar6 & 0x3f;
  uVar4 = uVar6 - p->k;
  uVar7 = uVar6 >> 6;
  bVar3 = (byte)uVar4 & 0x3f;
  uVar5 = uVar4 >> 6;
  uVar6 = (uVar6 + 0x3f >> 6) * 2 - 1;
  if (uVar7 < uVar6) {
    do {
      uVar1 = a[uVar6];
      a[(uVar6 - 1) - uVar7] = a[(uVar6 - 1) - uVar7] ^ uVar1 << (0x40 - bVar2 & 0x3f);
      a[uVar6 - uVar7] = a[uVar6 - uVar7] ^ uVar1 >> bVar2;
      uVar8 = uVar1 << (0x40 - bVar3 & 0x3f);
      if ((uVar4 & 0x3f) == 0) {
        uVar8 = 0;
      }
      a[(uVar6 - 1) - uVar5] = a[(uVar6 - 1) - uVar5] ^ uVar8;
      a[uVar6 - uVar5] = a[uVar6 - uVar5] ^ uVar1 >> bVar3;
      uVar6 = uVar6 - 1;
    } while (uVar7 < uVar6);
  }
  uVar7 = a[uVar6];
  *a = *a ^ uVar7 >> bVar2;
  uVar7 = (uVar7 >> bVar2) << bVar2;
  if (((uVar4 & 0x3f) != 0) && (uVar5 < uVar6)) {
    a[uVar6 + ~uVar5] = a[uVar6 + ~uVar5] ^ uVar7 << (-bVar3 & 0x3f);
  }
  a[uVar6 - uVar5] = a[uVar6 - uVar5] ^ uVar7 >> bVar3;
  a[uVar6] = a[uVar6] ^ uVar7;
  return;
}

Assistant:

void ppRedTrinomial(word a[], const pp_trinom_st* p)
{
	register word hi;
	size_t mb, mw, kb, kw;
	size_t n;
	// pre
	ASSERT(memIsValid(p, sizeof(pp_trinom_st)));
	ASSERT(wwIsValid(a, 2 * W_OF_B(p->m)));
	ASSERT(p->m % 8 != 0);
	ASSERT(p->m > p->k && p->k > 0);
	ASSERT(p->m - p->k >= B_PER_W);
	// разбор трехчлена
	mb = p->m % B_PER_W;
	mw = p->m / B_PER_W;
	kb = (p->m - p->k) % B_PER_W;
	kw = (p->m - p->k) / B_PER_W;
	// обработать старшие слова
	for (n = 2 * W_OF_B(p->m); --n > mw;)
	{
		hi = a[n];
		a[n - mw - 1] ^= hi << (B_PER_W - mb);
		a[n - mw] ^= hi >> mb;
		a[n - kw - 1] ^= kb ? hi << (B_PER_W - kb) : 0;
		a[n - kw] ^= hi >> kb;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == mw);
	hi = a[n] >> mb;
	a[0] ^= hi;
	hi <<= mb;
	if (kw < n && kb)
		a[n - kw - 1] ^= hi << (B_PER_W - kb);
	a[n - kw] ^= hi >> kb;
	a[n] ^= hi;
	// очистка
	hi = 0;
}